

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManMuxesRef(Aig_Man_t *pAig,Vec_Ptr_t *vMuxes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  if (0 < vMuxes->nSize) {
    lVar3 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)vMuxes->pArray[lVar3];
      iVar1 = Aig_ObjRecognizeExor(pAVar2,&local_38,&local_40);
      if (iVar1 == 0) {
        pAVar2 = Aig_ObjRecognizeMux(pAVar2,&local_38,&local_40);
      }
      else {
        *(ulong *)&local_38->field_0x18 =
             *(ulong *)&local_38->field_0x18 & 0xffffffff0000003f |
             (ulong)((int)*(ulong *)&local_38->field_0x18 + 0x40U & 0xffffffc0);
        pAVar2 = local_40;
      }
      *(ulong *)&pAVar2->field_0x18 =
           *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)&pAVar2->field_0x18 + 0x40U & 0xffffffc0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vMuxes->nSize);
  }
  return;
}

Assistant:

void Aig_ManMuxesRef( Aig_Man_t * pAig, Vec_Ptr_t * vMuxes )
{
    Aig_Obj_t * pObj, * pNodeT, * pNodeE, * pNodeC;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMuxes, pObj, i )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pNodeT, &pNodeE ) )
        {
            pNodeT->nRefs++;
            pNodeE->nRefs++;
        }
        else
        {
            pNodeC = Aig_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
            pNodeC->nRefs++;
        }
    }
}